

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_expression_assertion.hpp
# Opt level: O2

void __thiscall
iutest::detail::ExpressionLHS<unsigned_long>::ExpressionLHS
          (ExpressionLHS<unsigned_long> *this,unsigned_long *lhs)

{
  this->m_lhs = *lhs;
  (this->m_message)._M_dataplus._M_p = (pointer)&(this->m_message).field_2;
  (this->m_message)._M_string_length = 0;
  (this->m_message).field_2._M_local_buf[0] = '\0';
  AppendMessage<unsigned_long>(this,&this->m_lhs);
  return;
}

Assistant:

explicit ExpressionLHS(T&& lhs) : m_lhs( ::std::forward<T>(lhs) )
    {
        AppendMessage(m_lhs);
    }